

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocaltime.cpp
# Opt level: O0

qint64 anon_unknown.dwarf_28f893::secondsBetween(tm *start,tm *stop)

{
  long lVar1;
  tm when;
  int *in_RSI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  qint64 diff;
  tm from;
  undefined8 in_stack_ffffffffffffff60;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  when._8_8_ = in_RSI;
  when._0_8_ = in_stack_ffffffffffffff60;
  when._16_8_ = in_RDI;
  when._24_8_ = *in_RDI;
  when._32_8_ = in_RDI[1];
  when.tm_gmtoff = in_RDI[2];
  when.tm_zone = (char *)in_RDI[3];
  matchYearMonth(when,(tm *)in_RDI[4]);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (((long)in_RSI[2] + (long)(in_RSI[3] + 0x55555556) * 0x18 + 0x55555556) * 0x3c +
            (long)in_RSI[1] + 0x55555556) * 0x3c + (long)*in_RSI + 0x55555556;
  }
  __stack_chk_fail();
}

Assistant:

Q_DECL_COLD_FUNCTION
qint64 secondsBetween(const struct tm &start, const struct tm &stop)
{
    // Nominal difference between start and stop, in seconds (negative if start
    // is after stop); may differ from actual UTC difference if there's a
    // transition between them.
    struct tm from = matchYearMonth(start, stop);
    qint64 diff = stop.tm_mday - from.tm_mday; // in days
    diff = diff * 24 + stop.tm_hour - from.tm_hour; // in hours
    diff = diff * 60 + stop.tm_min - from.tm_min; // in minutes
    return diff * 60 + stop.tm_sec - from.tm_sec; // in seconds
}